

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_graphics_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *pIVar1;
  VkGraphicsPipelineLibraryFlagsEXT VVar2;
  VkPipelineBinaryInfoKHR *pVVar3;
  ulong uVar4;
  VkGraphicsPipelineCreateInfo *create_info_00;
  VkPipelineShaderStageCreateInfo *this_00;
  bool bVar5;
  VkGraphicsPipelineCreateInfo *new_info;
  WorkItem local_50;
  
  create_info_00 = (VkGraphicsPipelineCreateInfo *)pipeline;
  pVVar3 = find_pnext<VkPipelineBinaryInfoKHR>((VkStructureType)create_info->pNext,pipeline);
  if ((pVVar3 == (VkPipelineBinaryInfoKHR *)0x0) || (bVar5 = true, pVVar3->binaryCount == 0)) {
    VVar2 = graphics_pipeline_get_effective_state_flags((Fossilize *)create_info,create_info_00);
    pIVar1 = this->impl;
    if ((VVar2 & 6) != 0) {
      uVar4 = (ulong)create_info->stageCount;
      this_00 = create_info->pStages;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        bVar5 = shader_stage_is_identifier_only
                          ((Fossilize *)this_00,(VkPipelineShaderStageCreateInfo *)create_info_00);
        if ((bVar5) && (pIVar1->should_record_identifier_only == false)) {
          std::mutex::lock(&pIVar1->record_lock);
          if (pipeline != (VkPipeline)0x0) {
            Impl::push_unregister_locked<VkPipeline_T*>
                      (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
          goto LAB_00113d0c;
        }
        this_00 = this_00 + 1;
      }
    }
    std::mutex::lock(&pIVar1->record_lock);
    new_info = (VkGraphicsPipelineCreateInfo *)0x0;
    bVar5 = Impl::copy_graphics_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar5) {
      local_50.type = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
    }
    else if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
    if (bVar5) {
      Impl::pump_synchronized_recording(this->impl,this);
LAB_00113d0c:
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool StateRecorder::record_graphics_pipeline(VkPipeline pipeline, const VkGraphicsPipelineCreateInfo &create_info,
                                             const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                             Hash custom_hash,
                                             VkDevice device,
                                             PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// We are not allowed to look at pStages unless we're emitting pre-raster / fragment shader interface.
	// If we are using module identifier data + on use, we need to push it for record.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);
	if (graphics_pipeline_library_state_flags_have_module_state(state_flags))
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
			    !impl->should_record_identifier_only)
			{
				// Have to forget any reference if this API handle is recycled.
				std::lock_guard<std::mutex> lock(impl->record_lock);
				if (pipeline != VK_NULL_HANDLE)
					impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
				return true;
			}
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkGraphicsPipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_graphics_pipeline(&create_info, impl->temp_allocator,
		                                  base_pipelines, base_pipeline_count,
		                                  device, gsmcii,
		                                  &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}